

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_0::MaybeRestartJavaMethod
               (Printer *printer,int *bytecode_estimate,int *method_num,char *chain_statement,
               char *method_decl)

{
  int iVar1;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum local_88;
  string local_58;
  char *local_38;
  
  if (0x8000 < *bytecode_estimate) {
    iVar1 = *method_num;
    *method_num = iVar1 + 1;
    local_38 = method_decl;
    strings::AlphaNum::AlphaNum(&local_88,iVar1 + 1);
    StrCat_abi_cxx11_(&local_58,(protobuf *)&local_88,a);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,chain_statement,(char (*) [11])"method_num",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    google::protobuf::io::Printer::Outdent();
    io::Printer::Print<>(printer,"}\n");
    strings::AlphaNum::AlphaNum(&local_88,*method_num);
    StrCat_abi_cxx11_(&local_58,(protobuf *)&local_88,a_00);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,local_38,(char (*) [11])"method_num",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    google::protobuf::io::Printer::Indent();
    *bytecode_estimate = 0;
  }
  return;
}

Assistant:

void MaybeRestartJavaMethod(io::Printer* printer, int* bytecode_estimate,
                            int* method_num, const char* chain_statement,
                            const char* method_decl) {
  // The goal here is to stay under 64K bytes of jvm bytecode/method,
  // since otherwise we hit a hardcoded limit in the jvm and javac will
  // then fail with the error "code too large". This limit lets our
  // estimates be off by a factor of two and still we're okay.
  static const int bytesPerMethod = kMaxStaticSize;

  if ((*bytecode_estimate) > bytesPerMethod) {
    ++(*method_num);
    printer->Print(chain_statement, "method_num", StrCat(*method_num));
    printer->Outdent();
    printer->Print("}\n");
    printer->Print(method_decl, "method_num", StrCat(*method_num));
    printer->Indent();
    *bytecode_estimate = 0;
  }
}